

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O0

void poly1305_donna::poly1305_update(poly1305_context *st,uchar *m,size_t bytes)

{
  long lVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t want_1;
  size_t want;
  size_t i;
  size_t in_stack_00000048;
  uchar *in_stack_00000050;
  poly1305_context *in_stack_00000058;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (*(long *)(in_RDI + 0x38) != 0) {
    local_30 = 0x10 - *(long *)(in_RDI + 0x38);
    if (in_RDX < local_30) {
      local_30 = in_RDX;
    }
    for (local_28 = 0; local_28 < local_30; local_28 = local_28 + 1) {
      *(undefined1 *)(in_RDI + 0x40 + *(long *)(in_RDI + 0x38) + local_28) =
           *(undefined1 *)(in_RSI + local_28);
    }
    local_20 = in_RDX - local_30;
    local_18 = local_30 + in_RSI;
    *(ulong *)(in_RDI + 0x38) = local_30 + *(long *)(in_RDI + 0x38);
    if (*(ulong *)(in_RDI + 0x38) < 0x10) goto LAB_01b3d18a;
    poly1305_blocks(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  if (0xf < local_20) {
    poly1305_blocks(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    local_18 = (local_20 & 0xfffffffffffffff0) + local_18;
    local_20 = local_20 - (local_20 & 0xfffffffffffffff0);
  }
  if (local_20 != 0) {
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      *(undefined1 *)(in_RDI + 0x40 + *(long *)(in_RDI + 0x38) + local_28) =
           *(undefined1 *)(local_18 + local_28);
    }
    *(ulong *)(in_RDI + 0x38) = local_20 + *(long *)(in_RDI + 0x38);
  }
LAB_01b3d18a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void poly1305_update(poly1305_context *st, const unsigned char *m, size_t bytes) noexcept {
    size_t i;

    /* handle leftover */
    if (st->leftover) {
        size_t want = (POLY1305_BLOCK_SIZE - st->leftover);
        if (want > bytes) {
            want = bytes;
        }
        for (i = 0; i < want; i++) {
            st->buffer[st->leftover + i] = m[i];
        }
        bytes -= want;
        m += want;
        st->leftover += want;
        if (st->leftover < POLY1305_BLOCK_SIZE) return;
        poly1305_blocks(st, st->buffer, POLY1305_BLOCK_SIZE);
        st->leftover = 0;
    }

    /* process full blocks */
    if (bytes >= POLY1305_BLOCK_SIZE) {
        size_t want = (bytes & ~(POLY1305_BLOCK_SIZE - 1));
        poly1305_blocks(st, m, want);
        m += want;
        bytes -= want;
    }

    /* store leftover */
    if (bytes) {
        for (i = 0; i < bytes; i++) {
            st->buffer[st->leftover + i] = m[i];
        }
        st->leftover += bytes;
    }
}